

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QBrush>::copyAppend(QGenericArrayOps<QBrush> *this,QBrush *b,QBrush *e)

{
  qsizetype *pqVar1;
  QBrush *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QBrush>).ptr;
    for (; b < e; b = b + 1) {
      QBrush::QBrush(pQVar2 + (this->super_QArrayDataPointer<QBrush>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QBrush>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }